

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

Expected<llvm::DWARFDebugNames::Entry> * __thiscall
llvm::DWARFDebugNames::NameIndex::getEntry
          (Expected<llvm::DWARFDebugNames::Entry> *__return_storage_ptr__,NameIndex *this,
          uint64_t *Offset)

{
  bool bVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  char *pcVar4;
  Expected<llvm::DWARFDebugNames::Entry> *pEVar5;
  long lVar6;
  FormParams FP;
  DWARFFormValue *this_00;
  DWARFDataExtractor *Data;
  const_iterator cVar7;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  undefined1 local_118 [8];
  Entry E;
  Error local_58;
  Error local_50;
  uint local_44;
  Error EStack_40;
  uint32_t AbbrevCode;
  Expected<llvm::DWARFDebugNames::Entry> *local_38;
  
  local_38 = __return_storage_ptr__;
  if (*Offset < (this->Section->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.
                Length) {
    Data = &(this->Section->super_DWARFAcceleratorTable).AccelSection;
    uVar2 = DataExtractor::getULEB128(&Data->super_DataExtractor,Offset,(Error *)0x0);
    local_44 = (uint)uVar2;
    if (local_44 == 0) {
      puVar3 = (undefined8 *)operator_new(8);
      *puVar3 = &PTR__ErrorInfoBase_01077f38;
      local_58.Payload = (ErrorInfoBase *)((ulong)puVar3 | 1);
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_58);
      local_50.Payload = local_58.Payload;
    }
    else {
      cVar7 = DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
              ::find_as<unsigned_int>
                        ((DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
                          *)this,&local_44);
      if (&(cVar7.Ptr)->key !=
          &(this->Abbrevs).
           super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
           .TheMap.Buckets
           [(this->Abbrevs).
            super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
            .TheMap.NumBuckets].key) {
        DWARFDebugNames::Entry::Entry((Entry *)local_118,this,&(cVar7.Ptr)->key);
        if ((ulong)(uint)E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                         super_SmallVectorBase.BeginX != 0) {
          FP.AddrSize = '\0';
          FP.Format = DWARF32;
          FP.Version = (this->Hdr).super_HeaderPOD.Version;
          lVar6 = (ulong)(uint)E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                               super_SmallVectorBase.BeginX * 0x30;
          this_00 = (DWARFFormValue *)E.super_Entry._vptr_Entry;
          do {
            bVar1 = DWARFFormValue::extractValue
                              (this_00,Data,Offset,FP,(DWARFContext *)0x0,(DWARFUnit *)0x0);
            if (!bVar1) {
              pcVar4 = (char *)std::_V2::generic_category();
              EC_01._M_cat = (error_category *)0x5;
              EC_01._0_8_ = &stack0xffffffffffffffc0;
              createStringError(EC_01,pcVar4);
              Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&stack0xffffffffffffffc0);
              pEVar5 = local_38;
              if ((long *)((ulong)EStack_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
                (**(code **)(*(long *)((ulong)EStack_40.Payload & 0xfffffffffffffffe) + 8))();
                pEVar5 = local_38;
              }
              goto LAB_00d4b44f;
            }
            this_00 = this_00 + 1;
            lVar6 = lVar6 + -0x30;
          } while (lVar6 != 0);
        }
        pEVar5 = local_38;
        local_38->field_0xb8 = local_38->field_0xb8 & 0xfe;
        *(undefined ***)(local_38->field_0).ErrorStorage.buffer = &PTR___cxa_pure_virtual_01077f88;
        SmallVector<llvm::DWARFFormValue,_3U>::SmallVector
                  ((SmallVector<llvm::DWARFFormValue,_3U> *)((long)&local_38->field_0 + 8),
                   (SmallVector<llvm::DWARFFormValue,_3U> *)&E);
        *(undefined ***)(pEVar5->field_0).ErrorStorage.buffer = &PTR_getCUOffset_01077e88;
        *(undefined8 *)((long)&pEVar5->field_0 + 0xa8) =
             E.super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>.InlineElts[2].
             buffer._40_8_;
        *(NameIndex **)((long)&pEVar5->field_0 + 0xb0) = E.NameIdx;
LAB_00d4b44f:
        local_118 = (undefined1  [8])&PTR___cxa_pure_virtual_01077f88;
        if (E.super_Entry._vptr_Entry ==
            (_func_int **)
            ((long)&E.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
                    super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.
                    super_SmallVectorBase + 8U)) {
          return pEVar5;
        }
        free(E.super_Entry._vptr_Entry);
        return local_38;
      }
      pcVar4 = (char *)std::_V2::generic_category();
      EC_00._M_cat = (error_category *)0x16;
      EC_00._0_8_ = &local_50;
      createStringError(EC_00,pcVar4);
      Expected<llvm::DWARFDebugNames::Entry>::Expected(local_38,&local_50);
    }
  }
  else {
    pcVar4 = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x54;
    EC._0_8_ = &E.Abbr;
    createStringError(EC,pcVar4);
    Expected<llvm::DWARFDebugNames::Entry>::Expected(__return_storage_ptr__,(Error *)&E.Abbr);
    local_50.Payload = (ErrorInfoBase *)E.Abbr;
  }
  if ((long *)((ulong)local_50.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_50.Payload & 0xfffffffffffffffe) + 8))();
  }
  return local_38;
}

Assistant:

Expected<DWARFDebugNames::Entry>
DWARFDebugNames::NameIndex::getEntry(uint64_t *Offset) const {
  const DWARFDataExtractor &AS = Section.AccelSection;
  if (!AS.isValidOffset(*Offset))
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated entry list.");

  uint32_t AbbrevCode = AS.getULEB128(Offset);
  if (AbbrevCode == 0)
    return make_error<SentinelError>();

  const auto AbbrevIt = Abbrevs.find_as(AbbrevCode);
  if (AbbrevIt == Abbrevs.end())
    return createStringError(errc::invalid_argument, "Invalid abbreviation.");

  Entry E(*this, *AbbrevIt);

  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};
  for (auto &Value : E.Values) {
    if (!Value.extractValue(AS, Offset, FormParams))
      return createStringError(errc::io_error,
                               "Error extracting index attribute values.");
  }
  return std::move(E);
}